

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

void __thiscall Pda::addNode(Pda *this,Node *n,bool start,bool end)

{
  bool end_local;
  Node *pNStack_18;
  bool start_local;
  Node *n_local;
  Pda *this_local;
  
  pNStack_18 = n;
  n_local = (Node *)this;
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
            (&this->allNodes,&stack0xffffffffffffffe8);
  if (start) {
    this->start = pNStack_18;
  }
  if (end) {
    std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::push_back
              (&this->endNodes,&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void Pda::addNode(Tjen::Node *n, bool start, bool end) {
    this->allNodes.push_back(n);

    if(start){
        this->start = n;
    }
    if(end){
        this->endNodes.push_back(n);
    }
}